

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_replacer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnBindingReplacer::VisitExpression
          (ColumnBindingReplacer *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  pointer pRVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  idx_t iVar2;
  pointer pEVar3;
  BoundColumnRefExpression *pBVar4;
  pointer pRVar5;
  type pEVar6;
  undefined8 extraout_RDX;
  LogicalType *pLVar7;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if ((pEVar3->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar3->super_BaseExpression);
    pRVar5 = (this->replacement_bindings).
             super_vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>.
             super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->replacement_bindings).
             super_vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>.
             super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar5 != pRVar1) {
      pLVar7 = &pRVar5->new_type;
      do {
        if (((pBVar4->binding).table_index == *(idx_t *)((long)(pLVar7 + -2) + 8)) &&
           ((pBVar4->binding).column_index == *(idx_t *)((long)(pLVar7 + -2) + 0x10))) {
          iVar2 = ((ColumnBinding *)(pLVar7 + -1))->column_index;
          (pBVar4->binding).table_index = ((ColumnBinding *)(pLVar7 + -1))->table_index;
          (pBVar4->binding).column_index = iVar2;
          if ((*(bool *)((ColumnBinding *)(pLVar7 + -1) + 1) == true) &&
             (pLVar7 != &(pBVar4->super_Expression).return_type)) {
            (pBVar4->super_Expression).return_type.id_ = pLVar7->id_;
            (pBVar4->super_Expression).return_type.physical_type_ = pLVar7->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&(pBVar4->super_Expression).return_type.type_info_,&pLVar7->type_info_);
          }
        }
        pRVar5 = (pointer)(pLVar7 + 1);
        pLVar7 = (LogicalType *)((long)(pLVar7 + 2) + 0x10);
      } while (pRVar5 != pRVar1);
    }
  }
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (expression);
  UNRECOVERED_JUMPTABLE = (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[4];
  (*UNRECOVERED_JUMPTABLE)(this,pEVar6,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void ColumnBindingReplacer::VisitExpression(unique_ptr<Expression> *expression) {
	auto &expr = *expression;
	if (expr->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr->Cast<BoundColumnRefExpression>();
		for (const auto &replace_binding : replacement_bindings) {
			if (bound_column_ref.binding == replace_binding.old_binding) {
				bound_column_ref.binding = replace_binding.new_binding;
				if (replace_binding.replace_type) {
					bound_column_ref.return_type = replace_binding.new_type;
				}
			}
		}
	}

	VisitExpressionChildren(**expression);
}